

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageLabelDocumentHelper.cc
# Opt level: O3

QPDFObjectHandle
QPDFPageLabelDocumentHelper::pageLabelDict
          (qpdf_page_label_e label_type,int start_num,string_view prefix)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  undefined4 in_register_0000003c;
  element_type *this;
  QPDFObjectHandle QVar2;
  string local_80;
  undefined1 local_60 [32];
  QPDFObjectHandle local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  this = (element_type *)CONCAT44(in_register_0000003c,label_type);
  QVar2 = QPDFObjectHandle::newDictionary();
  _Var1._M_pi = QVar2.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  switch(start_num) {
  case 1:
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/S","");
    operator____qpdf(local_60,0x27c509);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_80,(QPDFObjectHandle *)local_60);
    _Var1._M_pi = extraout_RDX;
    break;
  case 2:
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/S","");
    operator____qpdf(local_60,0x27c6c3);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_80,(QPDFObjectHandle *)local_60);
    _Var1._M_pi = extraout_RDX_03;
    break;
  case 3:
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/S","");
    operator____qpdf(local_60,0x27c585);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_80,(QPDFObjectHandle *)local_60);
    _Var1._M_pi = extraout_RDX_01;
    break;
  case 4:
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/S","");
    operator____qpdf(local_60,0x27c6c6);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_80,(QPDFObjectHandle *)local_60);
    _Var1._M_pi = extraout_RDX_02;
    break;
  case 5:
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/S","");
    operator____qpdf(local_60,0x27c6c9);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_80,(QPDFObjectHandle *)local_60);
    _Var1._M_pi = extraout_RDX_00;
    break;
  default:
    goto switchD_001d603a_default;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
    _Var1._M_pi = extraout_RDX_04;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    _Var1._M_pi = extraout_RDX_05;
  }
switchD_001d603a_default:
  if (prefix._M_str != (char *)0x0) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/P","");
    local_60._0_8_ = (element_type *)(local_60 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60);
    QPDFObjectHandle::newUnicodeString(&local_40,(string *)local_60);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_80,&local_40);
    _Var1._M_pi = extraout_RDX_06;
    if (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      _Var1._M_pi = extraout_RDX_07;
    }
    if ((element_type *)local_60._0_8_ != (element_type *)(local_60 + 0x10)) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      _Var1._M_pi = extraout_RDX_08;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      _Var1._M_pi = extraout_RDX_09;
    }
  }
  if ((int)prefix._M_len != 1) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/St","");
    QPDFObjectHandle::newInteger((QPDFObjectHandle *)local_60,(long)(int)prefix._M_len);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_80,(QPDFObjectHandle *)local_60);
    _Var1._M_pi = extraout_RDX_10;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
      _Var1._M_pi = extraout_RDX_11;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      _Var1._M_pi = extraout_RDX_12;
    }
  }
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageLabelDocumentHelper::pageLabelDict(
    qpdf_page_label_e label_type, int start_num, std::string_view prefix)
{
    auto num = QPDFObjectHandle::newDictionary();
    switch (label_type) {
    case pl_none:
        break;
    case pl_digits:
        num.replaceKey("/S", "/D"_qpdf);
        break;
    case pl_alpha_lower:
        num.replaceKey("/S", "/a"_qpdf);
        break;
    case pl_alpha_upper:
        num.replaceKey("/S", "/A"_qpdf);
        break;
    case pl_roman_lower:
        num.replaceKey("/S", "/r"_qpdf);
        break;
    case pl_roman_upper:
        num.replaceKey("/S", "/R"_qpdf);
        break;
    }
    if (!prefix.empty()) {
        num.replaceKey("/P", QPDFObjectHandle::newUnicodeString(std::string(prefix)));
    }
    if (start_num != 1) {
        num.replaceKey("/St", QPDFObjectHandle::newInteger(start_num));
    }
    return num;
}